

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack-utils.cpp
# Opt level: O0

bool wasm::StackSignature::haveLeastUpperBound(StackSignature a,StackSignature b)

{
  StackSignature self;
  StackSignature other;
  StackSignature other_00;
  StackSignature self_00;
  bool bVar1;
  bool bVar2;
  undefined8 in_stack_00000008;
  bool local_b9;
  bool resultsOk;
  __1 local_71 [7];
  bool paramsOk;
  anon_class_1_0_00000001 valsCompatible;
  undefined1 local_a;
  bool local_9;
  anon_class_1_0_00000001 extensionCompatible;
  
  self.results.id = a.params.id;
  self.params.id = in_stack_00000008;
  self._16_8_ = a.results.id;
  other.results.id = b.params.id;
  other.params.id = a._16_8_;
  other._16_8_ = b.results.id;
  bVar1 = haveLeastUpperBound(wasm::StackSignature,wasm::StackSignature)::$_0::operator()
                    (&local_a,self,other);
  if ((bVar1) &&
     (self_00.results.id = b.params.id, self_00.params.id = a._16_8_, self_00._16_8_ = b.results.id,
     other_00.results.id = a.params.id, other_00.params.id = in_stack_00000008,
     other_00._16_8_ = a.results.id,
     bVar1 = haveLeastUpperBound(wasm::StackSignature,wasm::StackSignature)::$_0::operator()
                       (&local_a,self_00,other_00), bVar1)) {
    bVar1 = haveLeastUpperBound(wasm::StackSignature,wasm::StackSignature)::$_1::operator()
                      (local_71,in_stack_00000008,a._16_8_);
    bVar2 = haveLeastUpperBound(wasm::StackSignature,wasm::StackSignature)::$_1::operator()
                      (local_71,a.params.id,b.params.id);
    local_b9 = false;
    if (bVar1) {
      local_b9 = bVar2;
    }
    local_9 = local_b9;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool StackSignature::haveLeastUpperBound(StackSignature a, StackSignature b) {
  // If a signature is polymorphic, the LUB could extend its params and results
  // arbitrarily. Otherwise, the LUB must extend its params and results
  // uniformly so that each additional param is a subtype of the corresponding
  // additional result.
  auto extensionCompatible = [](auto self, auto other) -> bool {
    if (self.kind == Polymorphic) {
      return true;
    }
    // If no extension, then no problem.
    if (self.params.size() >= other.params.size() &&
        self.results.size() >= other.results.size()) {
      return true;
    }
    auto extSize = other.params.size() - self.params.size();
    if (extSize != other.results.size() - self.results.size()) {
      return false;
    }
    return std::equal(other.params.begin(),
                      other.params.begin() + extSize,
                      other.results.begin(),
                      other.results.begin() + extSize,
                      [](const Type& param, const Type& result) {
                        return Type::isSubType(param, result);
                      });
  };
  if (!extensionCompatible(a, b) || !extensionCompatible(b, a)) {
    return false;
  }

  auto valsCompatible = [](auto as, auto bs, auto compatible) -> bool {
    // Canonicalize so the as are shorter and any unshared prefix is on bs.
    if (bs.size() < as.size()) {
      std::swap(as, bs);
    }
    // Check that shared values after the unshared prefix have are compatible.
    size_t diff = bs.size() - as.size();
    for (size_t i = 0, shared = as.size(); i < shared; ++i) {
      if (!compatible(as[i], bs[i + diff])) {
        return false;
      }
    }
    return true;
  };

  bool paramsOk = valsCompatible(a.params, b.params, [](Type a, Type b) {
    assert(a == b && "TODO: calculate greatest lower bound to handle "
                     "contravariance correctly");
    return true;
  });
  bool resultsOk = valsCompatible(a.results, b.results, [](Type a, Type b) {
    return Type::getLeastUpperBound(a, b) != Type::none;
  });
  return paramsOk && resultsOk;
}